

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O0

uint32_t cppcms::impl::string_map::entry::calc_hash(char *key)

{
  char *in_RDI;
  char *s;
  uint32_t state;
  char *local_18;
  state_type local_c;
  
  local_c = 0;
  local_18 = in_RDI;
  while (*local_18 != '\0') {
    local_c = string_hash::update_state(local_c,*local_18);
    local_18 = local_18 + 1;
  }
  return local_c;
}

Assistant:

static uint32_t calc_hash(char const *key)
				{
					uint32_t state = cppcms::impl::string_hash::initial_state;
					char const *s = key;
					while(*s) {
						state = cppcms::impl::string_hash::update_state(state,*s++);
					}
					return state;
				}